

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void ImGui::StartMouseMovingWindow(ImGuiWindow *window)

{
  ImGuiWindow *in_RDI;
  ImVec2 IVar1;
  ImGuiContext *g;
  ImVec2 *in_stack_ffffffffffffffe8;
  ImGuiContext *pIVar2;
  
  pIVar2 = GImGui;
  FocusWindow((ImGuiWindow *)GImGui);
  SetActiveID(in_RDI->MoveId,in_RDI);
  pIVar2->NavDisableHighlight = true;
  IVar1 = operator-(in_stack_ffffffffffffffe8,(ImVec2 *)0x1390d9);
  pIVar2->ActiveIdClickOffset = IVar1;
  if (((in_RDI->Flags & 4U) == 0) && ((in_RDI->RootWindow->Flags & 4U) == 0)) {
    pIVar2->MovingWindow = in_RDI;
  }
  return;
}

Assistant:

void ImGui::StartMouseMovingWindow(ImGuiWindow* window)
{
    // Set ActiveId even if the _NoMove flag is set. Without it, dragging away from a window with _NoMove would activate hover on other windows.
    // We _also_ call this when clicking in a window empty space when io.ConfigWindowsMoveFromTitleBarOnly is set, but clear g.MovingWindow afterward.
    // This is because we want ActiveId to be set even when the window is stuck from moving.
    ImGuiContext& g = *GImGui;
    FocusWindow(window);
    SetActiveID(window->MoveId, window);
    g.NavDisableHighlight = true;
    g.ActiveIdClickOffset = g.IO.MousePos - window->RootWindow->Pos;
    if (!(window->Flags & ImGuiWindowFlags_NoMove) && !(window->RootWindow->Flags & ImGuiWindowFlags_NoMove))
        g.MovingWindow = window;
}